

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::Mutex::LockSlowWithDeadline
          (Mutex *this,MuHow how,Condition *cond,KernelTimeout t,int flags)

{
  ulong uVar1;
  bool bVar2;
  uint flags_00;
  bool bVar3;
  SynchWaitParams waitp;
  SynchWaitParams local_70;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((how->fast_need_zero & uVar1) == 0) {
    bVar2 = false;
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i =
           ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & uVar1 | how->fast_or) +
           how->fast_add;
    }
    UNLOCK();
    if (bVar3) {
      if (cond == (Condition *)0x0) {
        return true;
      }
      bVar3 = (*cond->eval_)(cond);
      bVar2 = true;
      if (bVar3) {
        return true;
      }
    }
  }
  else {
    bVar2 = false;
  }
  local_70.thread = &synchronization_internal::GetOrCreateCurrentThreadIdentity()->per_thread_synch;
  local_70.cvmu = (Mutex *)0x0;
  local_70.cv_word = (atomic<long> *)0x0;
  local_70.how = how;
  local_70.cond = cond;
  local_70.timeout.rep_ = t.rep_;
  local_70.contention_start_cycles = base_internal::CycleClock::Now();
  local_70.should_submit_contention_data = false;
  flags_00 = flags | 2;
  if (cond == (Condition *)0x0) {
    flags_00 = flags;
  }
  if (bVar2) {
    UnlockSlow(this,&local_70);
    Block(this,local_70.thread);
    flags_00 = flags_00 | 1;
  }
  LockSlowLoop(this,&local_70,flags_00);
  bVar2 = true;
  if ((cond != (Condition *)0x0) && (local_70.cond == (Condition *)0x0)) {
    bVar2 = (*cond->eval_)(cond);
  }
  return bVar2;
}

Assistant:

bool Mutex::LockSlowWithDeadline(MuHow how, const Condition* cond,
                                 KernelTimeout t, int flags) {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  bool unlock = false;
  if ((v & how->fast_need_zero) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(
          v,
          (how->fast_or |
           (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
              how->fast_add,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    if (cond == nullptr ||
        EvalConditionAnnotated(cond, this, true, false, how == kShared)) {
      return true;
    }
    unlock = true;
  }
  SynchWaitParams waitp(how, cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  if (cond != nullptr) {
    flags |= kMuIsCond;
  }
  if (unlock) {
    this->UnlockSlow(&waitp);
    this->Block(waitp.thread);
    flags |= kMuHasBlocked;
  }
  this->LockSlowLoop(&waitp, flags);
  return waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
         cond == nullptr ||
         EvalConditionAnnotated(cond, this, true, false, how == kShared);
}